

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComponentManager.cpp
# Opt level: O1

ErrorCode __thiscall ComponentManager::LoadLibrary(ComponentManager *this,char *name)

{
  Node *pNVar1;
  ErrorCode EVar2;
  void *pvVar3;
  code *pcVar4;
  code *pcVar5;
  undefined8 uVar6;
  IModule *pIVar7;
  ModuleInfo *pMVar8;
  Node *pNVar9;
  allocator<char> local_49;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  pvVar3 = (void *)dlopen(name,1);
  if (pvVar3 == (void *)0x0) {
    uVar6 = dlerror();
    jh_log_print(2,"virtual ErrorCode ComponentManager::LoadLibrary(const char *)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/ComponentManager.cpp"
                 ,0x54,"Failed to open shared lib \"%s\": %s",name,uVar6);
  }
  else {
    pcVar4 = (code *)dlsym(pvVar3,"JHCOM_LibraryEntry");
    pcVar5 = (code *)dlsym(pvVar3,"JHCOM_GetModule");
    if (pcVar4 != (code *)0x0 && pcVar5 != (code *)0x0) {
      EVar2 = (*pcVar4)(this);
      if (EVar2 != kNoError) {
        return EVar2;
      }
      pIVar7 = (IModule *)(*pcVar5)();
      (*(code *)**(undefined8 **)pIVar7)(pIVar7);
      (**(code **)(*(long *)pIVar7 + 0x30))(pIVar7);
      pMVar8 = (ModuleInfo *)
               operator_new(0x30,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/ComponentManager.cpp"
                            ,0x6b);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,name,&local_49);
      (pMVar8->mName)._M_dataplus._M_p = (pointer)&(pMVar8->mName).field_2;
      std::__cxx11::string::_M_construct<char*>((string *)pMVar8,local_48,local_40 + (long)local_48)
      ;
      pMVar8->mModule = pIVar7;
      pMVar8->mHandle = pvVar3;
      if (local_48 != local_38) {
        operator_delete(local_48,local_38[0] + 1);
      }
      pNVar9 = (Node *)operator_new(0x18,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/include/jh_list.h"
                                    ,0xa7);
      pNVar9->val = pMVar8;
      pNVar1 = (this->mModules).mTail;
      pNVar9->prev = pNVar1->prev;
      pNVar9->next = pNVar1;
      pNVar1->prev->next = pNVar9;
      pNVar1->prev = pNVar9;
      return kNoError;
    }
    jh_log_print(2,"virtual ErrorCode ComponentManager::LoadLibrary(const char *)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/ComponentManager.cpp"
                 ,0x5e,"Failed to get symbol");
  }
  return kLoadFailed;
}

Assistant:

ErrorCode ComponentManager::LoadLibrary( const char *name )
{
	TRACE_BEGIN( LOG_LVL_INFO );
	IModule *mod = NULL;
	ErrorCode result = kNoError;
	
	LOG_NOTICE( "Opening Library: %s", name );
	
	ErrorCode (*LoadLibrary)( IComponentManager *mgr );
	IModule *(*GetModule)();
	void *handle = dlopen( name, RTLD_LAZY );
	
	if ( handle == NULL )
	{
		result = kLoadFailed;
		LOG_WARN( "Failed to open shared lib \"%s\": %s", name, dlerror() );
	}
	else
	{
		LoadLibrary = (ErrorCode (*)(IComponentManager *mgr))dlsym( handle, "JHCOM_LibraryEntry" );
		GetModule = (IModule *(*)())dlsym( handle, "JHCOM_GetModule" );

		if ( GetModule == NULL || LoadLibrary == NULL )
		{
			result = kLoadFailed;
			LOG_WARN( "Failed to get symbol" );
		}
		else
		{
			LOG( "LoadLibrary is %p", LoadLibrary );
			LOG( "RegisterServices is %p", GetModule );
			result = LoadLibrary( this );
			
			if ( result == kNoError )
			{
				mod = GetModule();
				mod->AddRef();
				mod->loadComponents();
				ModuleInfo *info = jh_new ModuleInfo( name, mod, handle );
				mModules.push_back( info );
			}
		}
	}
	
	return result;
}